

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O3

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeHalfedgeVectorsInVertex
          (IntrinsicGeometryInterface *this)

{
  double dVar1;
  bool bVar2;
  SurfaceMesh *pSVar3;
  size_t sVar4;
  pointer puVar5;
  ulong uVar6;
  Vector2 *pVVar7;
  long lVar8;
  runtime_error *this_00;
  size_t i;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  size_t sVar12;
  double dVar13;
  double dVar14;
  double local_88;
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2> local_70;
  
  if (((this->super_BaseGeometryInterface).mesh)->useImplicitTwinFlag == false) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (this_00,
               "ERROR: Tangent spaces not implemented for general SurfaceMesh, use ManifoldSurfaceMesh"
              );
    __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((this->edgeLengthsQ).super_DependentQuantity.computed == false) {
    if ((this->edgeLengthsQ).super_DependentQuantity.evaluateFunc.super__Function_base._M_manager ==
        (_Manager_type)0x0) goto LAB_00186470;
    (*(this->edgeLengthsQ).super_DependentQuantity.evaluateFunc._M_invoker)
              ((_Any_data *)&(this->edgeLengthsQ).super_DependentQuantity.evaluateFunc);
    (this->edgeLengthsQ).super_DependentQuantity.computed = true;
  }
  if ((this->cornerScaledAnglesQ).super_DependentQuantity.computed == false) {
    if ((this->cornerScaledAnglesQ).super_DependentQuantity.evaluateFunc.super__Function_base.
        _M_manager == (_Manager_type)0x0) {
LAB_00186470:
      ::std::__throw_bad_function_call();
    }
    (*(this->cornerScaledAnglesQ).super_DependentQuantity.evaluateFunc._M_invoker)
              ((_Any_data *)&(this->cornerScaledAnglesQ).super_DependentQuantity.evaluateFunc);
    (this->cornerScaledAnglesQ).super_DependentQuantity.computed = true;
  }
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2>::MeshData
            (&local_70,(this->super_BaseGeometryInterface).mesh);
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2>::operator=
            (&this->halfedgeVectorsInVertex,&local_70);
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2>::~MeshData(&local_70);
  pSVar3 = (this->super_BaseGeometryInterface).mesh;
  sVar4 = pSVar3->nVerticesFillCount;
  if ((sVar4 == 0) ||
     (puVar5 = (pSVar3->vHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start, *puVar5 != 0xffffffffffffffff)) {
    sVar10 = 0;
  }
  else {
    sVar10 = 0;
    do {
      if (sVar4 - 1 == sVar10) {
        return;
      }
      lVar8 = sVar10 + 1;
      sVar10 = sVar10 + 1;
    } while (puVar5[lVar8] == 0xffffffffffffffff);
  }
  if (sVar10 != sVar4) {
    do {
      local_88 = 0.0;
      uVar6 = (pSVar3->vHalfedgeArr).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[sVar10];
      uVar11 = uVar6;
      do {
        dVar13 = cos(local_88);
        dVar14 = sin(local_88);
        bVar2 = pSVar3->useImplicitTwinFlag;
        if (bVar2 == true) {
          uVar9 = uVar11 >> 1;
        }
        else {
          uVar9 = (pSVar3->heEdgeArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar11];
        }
        dVar1 = (this->edgeLengths).data.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                [uVar9];
        pVVar7 = (this->halfedgeVectorsInVertex).data.
                 super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        pVVar7[uVar11].x = dVar1 * dVar13;
        pVVar7[uVar11].y = dVar14 * dVar1;
        sVar12 = sVar10;
        if (pSVar3->nFacesFillCount <=
            (pSVar3->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar11]) break;
        puVar5 = (pSVar3->heNextArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar9 = puVar5[puVar5[uVar11]];
        if (bVar2 == false) {
          uVar9 = (pSVar3->heSiblingArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9];
        }
        else {
          uVar9 = uVar9 ^ 1;
        }
        local_88 = local_88 +
                   (this->cornerScaledAngles).data.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   [uVar11];
        uVar11 = uVar9;
      } while (uVar9 != uVar6);
      do {
        if (sVar4 - 1 == sVar12) {
          return;
        }
        sVar10 = sVar12 + 1;
        lVar8 = sVar12 + 1;
        sVar12 = sVar10;
      } while ((pSVar3->vHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8] == 0xffffffffffffffff);
    } while (sVar4 != sVar10);
  }
  return;
}

Assistant:

void IntrinsicGeometryInterface::computeHalfedgeVectorsInVertex() {

  if (!mesh.usesImplicitTwin()) {
    throw std::runtime_error("ERROR: Tangent spaces not implemented for general SurfaceMesh, use ManifoldSurfaceMesh");
  }

  edgeLengthsQ.ensureHave();
  cornerScaledAnglesQ.ensureHave();

  halfedgeVectorsInVertex = HalfedgeData<Vector2>(mesh);

  for (Vertex v : mesh.vertices()) {
    double coordSum = 0.0;

    // Custom loop to orbit CCW
    Halfedge firstHe = v.halfedge();
    Halfedge currHe = firstHe;
    do {
      halfedgeVectorsInVertex[currHe] = Vector2::fromAngle(coordSum) * edgeLengths[currHe.edge()];
      coordSum += cornerScaledAngles[currHe.corner()];
      if (!currHe.isInterior()) break;
      currHe = currHe.next().next().twin();
    } while (currHe != firstHe);
  }
}